

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.c
# Opt level: O0

Qiniu_Digest * Qiniu_Digest_New(Qiniu_Digest_Type digest_type)

{
  int iVar1;
  EVP_MD_CTX *ctx;
  char *name;
  EVP_MD *type;
  Qiniu_Digest *digest;
  EVP_MD *md;
  EVP_MD_CTX *md_ctx;
  Qiniu_Digest *pQStack_10;
  Qiniu_Digest_Type digest_type_local;
  
  ctx = (EVP_MD_CTX *)EVP_MD_CTX_new();
  if (ctx == (EVP_MD_CTX *)0x0) {
    pQStack_10 = (Qiniu_Digest *)0x0;
  }
  else {
    name = Qiniu_Digest_Type_To_Name(digest_type);
    type = EVP_get_digestbyname(name);
    if (type == (EVP_MD *)0x0) {
      EVP_MD_CTX_free(ctx);
      pQStack_10 = (Qiniu_Digest *)0x0;
    }
    else {
      iVar1 = EVP_DigestInit_ex(ctx,type,(ENGINE *)0x0);
      if (iVar1 == 0) {
        pQStack_10 = (Qiniu_Digest *)0x0;
      }
      else {
        pQStack_10 = (Qiniu_Digest *)malloc(8);
        if (pQStack_10 == (Qiniu_Digest *)0x0) {
          EVP_MD_CTX_free(ctx);
          pQStack_10 = (Qiniu_Digest *)0x0;
        }
        else {
          memset(pQStack_10,0,8);
          pQStack_10->md_ctx = (EVP_MD_CTX *)ctx;
        }
      }
    }
  }
  return pQStack_10;
}

Assistant:

Qiniu_Digest *Qiniu_Digest_New(Qiniu_Digest_Type digest_type)
{

	EVP_MD_CTX *md_ctx = EVP_MD_CTX_new();
	if (md_ctx == NULL) {
		return NULL;
	}
	const EVP_MD* md = EVP_get_digestbyname(Qiniu_Digest_Type_To_Name(digest_type));
	if (md == NULL) {
		EVP_MD_CTX_free(md_ctx);
		return NULL;
	}
	if (EVP_DigestInit_ex(md_ctx, md, NULL) == 0) {
		return NULL;
	}
	Qiniu_Digest *digest = malloc(sizeof(Qiniu_Digest));
	if (digest == NULL) {
		EVP_MD_CTX_free(md_ctx);
		return NULL;
	}
	memset(digest, 0, sizeof(Qiniu_Digest));
	digest->md_ctx = md_ctx;
	return digest;
}